

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressBegin(ZSTD_DCtx *dctx)

{
  size_t sVar1;
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    sVar1 = ZSTD_startingInputLength(dctx._4_4_);
    in_RDI[0xe9c] = sVar1;
    *(undefined4 *)((long)in_RDI + 0x752c) = 0;
    in_RDI[0xea3] = 0;
    in_RDI[0xea4] = 0;
    in_RDI[0xe98] = 0;
    in_RDI[0xe99] = 0;
    in_RDI[0xe9a] = 0;
    in_RDI[0xe9b] = 0;
    *(undefined4 *)(in_RDI + 0x507) = 0xc00000c;
    *(undefined4 *)((long)in_RDI + 0x7534) = 0;
    *(undefined4 *)(in_RDI + 0xea6) = 0;
    *(undefined4 *)(in_RDI + 0xebf) = 0;
    *(undefined4 *)(in_RDI + 0xea5) = 3;
    ((U32 *)((long)in_RDI + 0x683c))[0] = 1;
    ((U32 *)((long)in_RDI + 0x683c))[1] = 4;
    *(undefined4 *)((long)in_RDI + 0x6844) = 8;
    *in_RDI = (long)(in_RDI + 4);
    in_RDI[1] = (long)(in_RDI + 0x306);
    in_RDI[2] = (long)(in_RDI + 0x205);
    in_RDI[3] = (long)(in_RDI + 0x507);
    return 0;
  }
  __assert_fail("dctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa14a,"size_t ZSTD_decompressBegin(ZSTD_DCtx *)");
}

Assistant:

size_t ZSTD_decompressBegin(ZSTD_DCtx* dctx)
{
    assert(dctx != NULL);
#if ZSTD_TRACE
    dctx->traceCtx = (ZSTD_trace_decompress_begin != NULL) ? ZSTD_trace_decompress_begin(dctx) : 0;
#endif
    dctx->expected = ZSTD_startingInputLength(dctx->format);  /* dctx->format must be properly set */
    dctx->stage = ZSTDds_getFrameHeaderSize;
    dctx->processedCSize = 0;
    dctx->decodedSize = 0;
    dctx->previousDstEnd = NULL;
    dctx->prefixStart = NULL;
    dctx->virtualStart = NULL;
    dctx->dictEnd = NULL;
    dctx->entropy.hufTable[0] = (HUF_DTable)((ZSTD_HUFFDTABLE_CAPACITY_LOG)*0x1000001);  /* cover both little and big endian */
    dctx->litEntropy = dctx->fseEntropy = 0;
    dctx->dictID = 0;
    dctx->bType = bt_reserved;
    ZSTD_STATIC_ASSERT(sizeof(dctx->entropy.rep) == sizeof(repStartValue));
    ZSTD_memcpy(dctx->entropy.rep, repStartValue, sizeof(repStartValue));  /* initial repcodes */
    dctx->LLTptr = dctx->entropy.LLTable;
    dctx->MLTptr = dctx->entropy.MLTable;
    dctx->OFTptr = dctx->entropy.OFTable;
    dctx->HUFptr = dctx->entropy.hufTable;
    return 0;
}